

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

uint64_t __thiscall
tonk::Connection::tonk_from_local_time_16(Connection *this,uint16_t networkTimestamp16)

{
  __int_type_conflict localUsec_00;
  uint64_t uVar1;
  unsigned_short in_SI;
  uint64_t localUsec;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffd8;
  Counter16 *in_stack_ffffffffffffffe0;
  undefined6 in_stack_fffffffffffffff0;
  
  localUsec_00 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffd8);
  Counter<unsigned_short,_16U>::Counter
            ((Counter<unsigned_short,_16U> *)&stack0xffffffffffffffe6,in_SI);
  uVar1 = TimeSynchronizer::FromLocalTime16
                    ((TimeSynchronizer *)CONCAT26(in_SI,in_stack_fffffffffffffff0),localUsec_00,
                     in_stack_ffffffffffffffe0);
  return uVar1;
}

Assistant:

uint64_t Connection::tonk_from_local_time_16(uint16_t networkTimestamp16)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Grab a recent timestamp as a basis for truncated timestamp decompression
    const uint64_t localUsec = LastTickUsec;

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());
    return TimeSync.FromLocalTime16(localUsec, networkTimestamp16);
}